

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_chunk_createv(ucvector *out,uint length,char *type,uchar *data)

{
  uint uVar1;
  uchar *chunk;
  uchar *local_20;
  
  uVar1 = lodepng_chunk_init(&local_20,out,length,type);
  if (uVar1 == 0) {
    if (length != 0) {
      memcpy(local_20 + 8,data,(ulong)length);
    }
    lodepng_chunk_generate_crc(local_20);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned lodepng_chunk_createv(ucvector* out,
  unsigned length, const char* type, const unsigned char* data) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, length, type));

  /*3: the data*/
  lodepng_memcpy(chunk + 8, data, length);

  /*4: CRC (of the chunkname characters and the data)*/
  lodepng_chunk_generate_crc(chunk);

  return 0;
}